

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

void __thiscall mkvmuxer::ContentEncoding::ContentEncoding(ContentEncoding *this)

{
  this->enc_algo_ = 5;
  this->enc_key_id_ = (uint8_t *)0x0;
  this->encoding_order_ = 0;
  this->encoding_scope_ = 1;
  this->encoding_type_ = 1;
  ContentEncAESSettings::ContentEncAESSettings(&this->enc_aes_settings_);
  this->enc_key_id_length_ = 0;
  return;
}

Assistant:

ContentEncoding::ContentEncoding()
    : enc_algo_(5),
      enc_key_id_(NULL),
      encoding_order_(0),
      encoding_scope_(1),
      encoding_type_(1),
      enc_key_id_length_(0) {}